

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void runTest<main::__82>(char *name,char condition)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  undefined1 auStack_48 [40];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 2;
  *(uint *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
  testNo = testNo + 1;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,testNo);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
  lVar2 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x28;
  lVar1 = *(long *)(lVar2 + -0x18);
  *(uint *)(std::ios_base::Init::Init + lVar1) =
       *(uint *)(std::ios_base::Init::Init + lVar1) & 0xffffff4f | 0x20;
  if (name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar2 + -0x18) + 0x1380f0);
  }
  else {
    sVar5 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ... ",5);
  std::ostream::flush();
  if (condition == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SKIPPED",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    skipped = skipped + 1;
  }
  else {
    calcHexHash<13ul,153ul>
              ((char (*) [13])"test key 001",
               (char (*) [153])
               "0b0b98bea7e805e0010a2126d287a2a0cc833d312cb786385a7c2f9de69d25537f584a9bc9977b00000000666fd8753bf61a8631f12984e3fd44f4014eca629276817b56f32e9b68bd82f416"
               ,auStack_48);
    bVar3 = equalsHex<65ul>(auStack_48,
                            (char (*) [65])
                            "c56414121acda1713c2f2a819d8ae38aed7c80c35c2a769298d34f03833cd5f1");
    if (!bVar3) {
      __assert_fail("equalsHex(hash, \"c56414121acda1713c2f2a819d8ae38aed7c80c35c2a769298d34f03833cd5f1\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kulupu[P]randomx/src/tests/tests.cpp"
                    ,0x3e1,"auto main()::(anonymous class)::operator()() const");
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PASSED",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  return;
}

Assistant:

void runTest(const char* name, bool condition, FUNC f) {
	std::cout << "[";
	std::cout.width(2);
	std::cout << std::right << ++testNo << "] ";
	std::cout.width(40);
	std::cout << std::left << name << " ... ";
	std::cout.flush();
	if (condition) {
		f();
		std::cout << "PASSED" << std::endl;
	}
	else {
		std::cout << "SKIPPED" << std::endl;
		skipped++;
	}
}